

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O2

void sysbvm_byteStream_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction(sysbvm_byteStream_primitive_nextPut,"ByteStream::nextPut:")
  ;
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteStream_primitive_nextPutAll,"ByteStream::nextPutAll:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteStream_primitive_nextPutString,"ByteStream::nextPutString:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteStream_primitive_asByteArray,"ByteStream::asByteArray");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteStream_primitive_asString,"ByteStream::asString");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteStream_primitive_asSymbol,"ByteStream::asSymbol");
  return;
}

Assistant:

void sysbvm_byteStream_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_byteStream_primitive_nextPut, "ByteStream::nextPut:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteStream_primitive_nextPutAll, "ByteStream::nextPutAll:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteStream_primitive_nextPutString, "ByteStream::nextPutString:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteStream_primitive_asByteArray, "ByteStream::asByteArray");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteStream_primitive_asString, "ByteStream::asString");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteStream_primitive_asSymbol, "ByteStream::asSymbol");
}